

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::ClassRandomizeFunction::ClassRandomizeFunction(ClassRandomizeFunction *this)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0063c090;
  sVar1 = parsing::toString(Randomize);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = Randomize;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00639140;
  (this->super_SystemSubroutine).withClauseMode = Randomize;
  return;
}

Assistant:

ClassRandomizeFunction() :
        SystemSubroutine(KnownSystemName::Randomize, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }